

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.hpp
# Opt level: O1

bool __thiscall
Amiga::MemoryMap::perform<CPU::MC68000::Microcycle<325u>>(MemoryMap *this,Microcycle<325U> *cycle)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = this->fast_autoconf_visible_;
  if (bVar1 == true) {
    uVar2 = 0xffff;
    switch(*cycle->address >> 1 & 0x7f) {
    case 0:
      uVar2 = 0xefff;
      break;
    case 1:
      uVar2._0_1_ = this->fast_ram_size_;
      uVar2._1_1_ = this->fast_autoconf_visible_;
      uVar2._2_1_ = this->overlay_;
      uVar2._3_1_ = this->field_0x80433;
      uVar2 = (uVar2 & 0xf) << 0xc | 0xfff;
      break;
    case 8:
    case 9:
      uVar2 = 0xafff;
      break;
    case 10:
    case 0xb:
      uVar2 = 0xbfff;
    }
    (cycle->value->field_1).b = (uint8_t)(uVar2 >> (~(byte)(*cycle->address << 3) & 8));
  }
  return bVar1;
}

Assistant:

bool perform(const Microcycle &cycle) {
			if(!fast_autoconf_visible_) return false;

			const uint32_t register_address = *cycle.address & 0xfe;

			if(cycle.operation & CPU::MC68000::Operation::Read) {
				// Re: Autoconf:
				//
				// "All read registers physically return only the top 4 bits of data, on D31-D28";
				// (this is from Zorro III documentation; I'm assuming it to be D15–D11 for the
				// 68000's 16-bit bus);
				//
				// "Every AUTOCONFIG register is logically considered to be 8 bits wide; the
				// 8 bits actually being nybbles from two paired addresses."

				uint8_t value = 0xf;
				switch(register_address) {
					default: break;

					case 0x00:	// er_Type (high)
						value =
							0xc |	// Zoro II-style PIC.
							0x2;	// Memory will be linked into the free pool
					break;
					case 0x02:	// er_Type (low)
						value = fast_ram_size_;
					break;

					// er_Manufacturer
					//
					// On the manufacturer number: this is supposed to be assigned
					// by Commodore. TODO: find and crib a real fast RAM number, if it matters.
					//
					// (0xffff seems to be invalid, so _something_ needs to be supplied)
					case 0x10:	case 0x12:
						value = 0xa; // Manufacturer's number, high byte.
					break;
					case 0x14:	case 0x16:
						value = 0xb;		// Manufacturer's number, low byte.
					break;
				}

				// Shove the value into the top of the data bus.
				cycle.set_value16(uint16_t(0x0fff | (value << 12)));
			} else {
				fast_autoconf_visible_ &= !(register_address >= 0x4c && register_address < 0x50);

				switch(register_address) {
					default: break;

					case 0x48: {	// ec_BaseAddress (A23–A16)
						const auto address = uint32_t(cycle.value8_high()) << 16;
						set_region(address, uint32_t(address + fast_ram_.size()), fast_ram_.data(), PermitRead | PermitWrite);
						fast_autoconf_visible_ = false;
					} break;
				}
			}

			return true;
		}